

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# square.hpp
# Opt level: O2

promote<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
* __thiscall
ising::free_energy::square::
finite_count<unsigned_int,double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul>>
          (promote<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_boost::math::differentiation::autodiff_v1::detail::fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>_>
           *__return_storage_ptr__,square *this,uint Lx,uint Ly,double Jx,double Jy,
          fvar<double,_2UL> beta,
          fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL> h)

{
  double dVar1;
  long lVar2;
  invalid_argument *piVar3;
  int_t s;
  undefined4 in_register_0000000c;
  undefined4 in_register_00000014;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *pfVar4;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *cr;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *extraout_RDX;
  uint uVar5;
  ulong uVar6;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *pfVar7;
  int_t c;
  uint uVar8;
  byte bVar9;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double dVar10;
  double dVar11;
  real_t mag;
  undefined1 local_248 [16];
  graph graph;
  double local_1e0;
  vector<double,_std::allocator<double>_> J;
  unitcell unitcell;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL> retval;
  basis basis;
  span_t local_158;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> local_108;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> local_c0;
  fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> retval_1;
  
  bVar9 = 0;
  local_248._8_4_ = in_XMM0_Dc;
  local_248._0_8_ = Jx;
  local_248._12_4_ = in_XMM0_Dd;
  if (((int)this != 0) && (Lx != 0)) {
    lattice::basis::simple(&basis,2);
    unitcell.dim_ = 2;
    unitcell.sites_.
    super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unitcell.sites_.
    super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    unitcell.sites_.
    super__Vector_base<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    unitcell.bonds_.
    super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    unitcell.bonds_.
    super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    unitcell.bonds_.
    super__Vector_base<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    lattice::coordinate((lattice *)&graph,0.0,0.0);
    lattice::unitcell::add_site(&unitcell,(coordinate_t *)&graph,0);
    free((void *)graph.dim_);
    lattice::offset((lattice *)&graph,1,0);
    lattice::unitcell::add_bond(&unitcell,0,0,(offset_t *)&graph,0);
    free((void *)graph.dim_);
    lattice::offset((lattice *)&graph,0,1);
    lattice::unitcell::add_bond(&unitcell,0,0,(offset_t *)&graph,1);
    free((void *)graph.dim_);
    lattice::extent(&local_158,(ulong)this & 0xffffffff,(ulong)Lx);
    lattice::graph::graph(&graph,&basis,&unitcell,&local_158,periodic);
    free(local_158.super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.m_data);
    if ((ulong)(((long)graph.sites_.
                       super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)graph.sites_.
                      super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x38) < 0x20) {
      std::vector<double,_std::allocator<double>_>::vector(&J,2,(allocator_type *)&local_158);
      *J.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = (double)local_248._0_8_;
      J.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data._M_start
      [1] = Jy;
      uVar8 = local_248._12_4_;
      dVar10 = (double)(Lx * (int)this);
      local_248._8_4_ = local_248._8_4_;
      local_248._0_8_ = -((double)local_248._0_8_ + Jy) * dVar10;
      local_248._12_4_ = uVar8 ^ 0x80000000;
      lVar2 = (long)graph.sites_.
                    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)graph.sites_.
                    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      pfVar4 = (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *)
               (lVar2 % 0x38);
      local_128 = 0;
      uStack_120 = 0;
      local_138 = 0;
      uStack_130 = 0;
      local_118 = 0;
      local_158.super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.m_cols = 0;
      uStack_140 = 0;
      local_158.super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.m_data =
           (long *)0x0;
      local_158.super_PlainObjectBase<Eigen::Matrix<long,__1,__1,_0,__1,__1>_>.m_storage.m_rows = 0;
      for (uVar8 = 0; uVar8 >> ((byte)(lVar2 / 0x38) & 0x1f) == 0; uVar8 = uVar8 + 1) {
        local_1e0 = 0.0;
        for (uVar5 = 0; uVar6 = (ulong)uVar5,
            uVar6 < (ulong)(((long)graph.bonds_.
                                   super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)graph.bonds_.
                                  super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x18);
            uVar5 = uVar5 + 1) {
          dVar11 = (double)((uVar8 >> ((uint)graph.bonds_.
                                             super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                                             ._M_impl.super__Vector_impl_data._M_start[uVar6].source
                                      & 0x1f) & 1) != 0);
          dVar1 = (double)((uVar8 >> ((uint)graph.bonds_.
                                            super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                                            ._M_impl.super__Vector_impl_data._M_start[uVar6].target
                                     & 0x1f) & 1) != 0);
          local_1e0 = local_1e0 -
                      (dVar11 + dVar11 + -1.0) *
                      J.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start
                      [graph.bonds_.
                       super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                       ._M_impl.super__Vector_impl_data._M_start[uVar6].type] *
                      (dVar1 + dVar1 + -1.0);
        }
        mag = 0.0;
        for (uVar5 = 0;
            (ulong)uVar5 <
            (ulong)(((long)graph.sites_.
                           super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)graph.sites_.
                          super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                          ._M_impl.super__Vector_impl_data._M_start) / 0x38); uVar5 = uVar5 + 1) {
          dVar1 = (double)((uVar8 >> (uVar5 & 0x1f) & 1) != 0);
          mag = mag + dVar1 + dVar1 + -1.0;
        }
        local_1e0 = (double)local_248._0_8_ - local_1e0;
        retval.v._M_elems[0].v._M_elems[2] = h.v._M_elems[0].v._M_elems[2];
        retval.v._M_elems[0].v._M_elems[0] = h.v._M_elems[0].v._M_elems[0];
        retval.v._M_elems[0].v._M_elems[1] = h.v._M_elems[0].v._M_elems[1];
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>::operator*=
                  (&retval,&mag);
        boost::math::differentiation::autodiff_v1::detail::operator-
                  ((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_0UL>
                    *)&local_c0,&local_1e0,&retval);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul>::operator*
                  ((promote<fvar<fvar<double,_2UL>,_0UL>,_fvar<double,_2UL>_> *)&retval_1,
                   (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,0ul> *)
                   &local_c0,&beta);
        boost::math::differentiation::autodiff_v1::detail::
        exp<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>
                  (&local_108,(detail *)&retval_1,cr);
        boost::math::differentiation::autodiff_v1::detail::
        fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>::operator+=
                  ((fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul> *)
                   &local_158,&local_108);
        pfVar4 = extraout_RDX;
      }
      boost::math::differentiation::autodiff_v1::detail::
      log<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>
                (&local_c0,(detail *)&local_158,pfVar4);
      pfVar4 = &local_c0;
      pfVar7 = &retval_1;
      for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
        (pfVar7->v)._M_elems[0].v._M_elems[0] = (pfVar4->v)._M_elems[0].v._M_elems[0];
        pfVar4 = (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *)
                 ((long)pfVar4 + ((ulong)bVar9 * -2 + 1) * 8);
        pfVar7 = (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL> *)
                 ((long)pfVar7 + ((ulong)bVar9 * -2 + 1) * 8);
      }
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL>::negate
                (&retval_1);
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul>::operator/
                (&local_108,
                 (fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>,2ul> *)
                 &retval_1,&beta);
      (__return_storage_ptr__->v)._M_elems[2].v._M_elems[1] = local_108.v._M_elems[2].v._M_elems[1];
      (__return_storage_ptr__->v)._M_elems[2].v._M_elems[2] = local_108.v._M_elems[2].v._M_elems[2];
      (__return_storage_ptr__->v)._M_elems[1].v._M_elems[2] = local_108.v._M_elems[1].v._M_elems[2];
      (__return_storage_ptr__->v)._M_elems[2].v._M_elems[0] = local_108.v._M_elems[2].v._M_elems[0];
      (__return_storage_ptr__->v)._M_elems[1].v._M_elems[0] = local_108.v._M_elems[1].v._M_elems[0];
      (__return_storage_ptr__->v)._M_elems[1].v._M_elems[1] = local_108.v._M_elems[1].v._M_elems[1];
      (__return_storage_ptr__->v)._M_elems[0].v._M_elems[1] = local_108.v._M_elems[0].v._M_elems[1];
      (__return_storage_ptr__->v)._M_elems[0].v._M_elems[2] = local_108.v._M_elems[0].v._M_elems[2];
      (__return_storage_ptr__->v)._M_elems[0].v._M_elems[0] =
           (double)local_248._0_8_ + local_108.v._M_elems[0].v._M_elems[0];
      retval.v._M_elems[0].v._M_elems[0] = dVar10;
      boost::math::differentiation::autodiff_v1::detail::
      fvar<boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>,_2UL>::operator/=
                (__return_storage_ptr__,(root_type *)&retval);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
                (&J.super__Vector_base<double,_std::allocator<double>_>);
      lattice::graph::~graph(&graph);
      lattice::unitcell::~unitcell(&unitcell);
      free(basis.basis_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
           m_data);
      return __return_storage_ptr__;
    }
    piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar3,"too large system size");
    __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar3 = (invalid_argument *)
           __cxa_allocate_exception
                     (0x10,this,CONCAT44(in_register_00000014,Lx),CONCAT44(in_register_0000000c,Ly))
  ;
  std::invalid_argument::invalid_argument(piVar3,"Lx and Ly should be positive");
  __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline boost::math::differentiation::promote<U, W> finite_count(I Lx, I Ly,
                                                                T Jx, T Jy,
                                                                U beta, W h) {
  typedef I int_t;
  typedef T real_t;
  typedef boost::math::differentiation::promote<U, W> value_t;
  if (Lx <= 0 || Ly <= 0)
    throw(std::invalid_argument("Lx and Ly should be positive"));

  auto basis = lattice::basis::simple(2);
  auto unitcell = lattice::unitcell(2);
  unitcell.add_site(lattice::coordinate(0, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(1, 0), 0);
  unitcell.add_bond(0, 0, lattice::offset(0, 1), 1);
  auto graph = lattice::graph(basis, unitcell, lattice::extent(Lx, Ly));
  if (graph.num_sites() >= 32)
    throw(std::invalid_argument("too large system size"));

  std::vector<real_t> J(2);
  J[0] = Jx;
  J[1] = Jy;
  real_t gs_energy = -(Jx + Jy) * (Lx * Ly);
  int_t num_states = 1 << graph.num_sites();
  value_t Z(0);
  for (int_t c = 0; c < num_states; ++c) {
    real_t energy = 0;
    for (int_t b = 0; b < graph.num_bonds(); ++b) {
      real_t ci = real_t(2) * ((c >> graph.source(b)) & 1) - 1;
      real_t cj = real_t(2) * ((c >> graph.target(b)) & 1) - 1;
      energy -= J[graph.bond_type(b)] * ci * cj;
    }
    real_t mag = 0;
    for (int_t s = 0; s < graph.num_sites(); ++s) {
      mag += real_t(2) * ((c >> s) & 1) - 1;
    }
    Z += exp((gs_energy - energy - h * mag) * beta);
  }
  return (-log(Z) / beta + gs_energy) / (Lx * Ly);
}